

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnElemSegmentElemType
          (BinaryReaderInterp *this,Index index,Type elem_type)

{
  Result RVar1;
  Location local_50;
  reference local_30;
  ElemDesc *elem;
  BinaryReaderInterp *pBStack_20;
  Index index_local;
  BinaryReaderInterp *this_local;
  Type elem_type_local;
  
  elem._4_4_ = index;
  pBStack_20 = this;
  unique0x1000007f = elem_type;
  local_30 = std::vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>::back
                       (&this->module_->elems);
  local_30->type = stack0xffffffffffffffec;
  GetLocation(&local_50,this);
  RVar1 = SharedValidator::OnElemSegmentElemType
                    (&this->validator_,&local_50,stack0xffffffffffffffec);
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderInterp::OnElemSegmentElemType(Index index, Type elem_type) {
  ElemDesc& elem = module_.elems.back();
  elem.type = elem_type;
  return validator_.OnElemSegmentElemType(GetLocation(), elem_type);
}